

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::InspectInstrForMemSetCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemSetEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  MemOpCandidate *pMVar2;
  Opnd *pOVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  SymID SVar7;
  BailOutKind BVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  
  if (((emitData == (MemSetEmitData *)0x0) ||
      (pMVar2 = (emitData->super_MemOpEmitData).candidate, pMVar2 == (MemOpCandidate *)0x0)) ||
     (pMVar2->type != MEMSET)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4456,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemSet())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemSet()");
    if (!bVar5) goto LAB_004747bc;
    *puVar11 = 0;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    if (DAT_015d346a == '\x01') {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar9,uVar10);
      if (!bVar5) {
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
        pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar9,uVar10);
        if (!bVar5) goto LAB_004744fe;
      }
      Output::Print(L"TRACE MemSet:");
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_a8);
      uVar9 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar9);
      Output::Print(L"Orphan LdElemI_A detected");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar15 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar15);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_004744fe:
    *errorInInstr = true;
    return false;
  }
  pMVar2 = (emitData->super_MemOpEmitData).candidate;
  if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
    return false;
  }
  OVar6 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar6 == OpndKindIndir) {
    pOVar3 = instr->m_dst;
    OVar6 = IR::Opnd::GetKind(pOVar3);
    if (OVar6 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_004747bc;
      *puVar11 = 0;
    }
    pSVar12 = IR::Opnd::GetStackSym((Opnd *)pOVar3[1]._vptr_Opnd);
    if (pSVar12 == (StackSym *)0x0) {
      pSVar12 = (StackSym *)0x0;
    }
    else if (pSVar12->m_type != TyVar) {
      pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0);
    }
    if (pSVar12 == (StackSym *)0x0) {
      SVar7 = 0xffffffff;
    }
    else {
      SVar7 = (pSVar12->super_Sym).m_id;
    }
    if (SVar7 == pMVar2->base) {
      pOVar3 = instr->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar3);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_004747bc;
        *puVar11 = 0;
      }
      pSVar12 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar3[1].m_valueType);
      if (pSVar12 == (StackSym *)0x0) {
        pSVar12 = (StackSym *)0x0;
      }
      else if (pSVar12->m_type != TyVar) {
        pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0);
      }
      if (pSVar12 == (StackSym *)0x0) {
        SVar7 = 0xffffffff;
      }
      else {
        SVar7 = (pSVar12->super_Sym).m_id;
      }
      if (SVar7 == pMVar2->index) {
        if (instr->m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x445f,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
          if (!bVar5) {
LAB_004747bc:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar11 = 0;
        }
        (emitData->super_MemOpEmitData).stElemInstr = instr;
        BVar8 = IR::Instr::GetBailOutKind(instr);
        (emitData->super_MemOpEmitData).bailOutKind = BVar8;
        return true;
      }
    }
  }
  if (DAT_015d346a == '\x01') {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar9,uVar10);
    if (!bVar5) {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar9,uVar10);
      if (!bVar5) goto LAB_004747a4;
    }
    Output::Print(L"TRACE MemSet:");
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_a8);
    uVar9 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar9);
    Output::Print(L"Orphan StElemI_A detected");
    IR::Instr::DumpByteCodeOffset(instr);
    pcVar15 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    Output::Print(L" (%s)",pcVar15);
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_004747a4:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemSetCandidate(Loop* loop, IR::Instr* instr, MemSetEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemSet());
    Loop::MemSetCandidate* candidate = (Loop::MemSetCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (instr->GetDst()->IsIndirOpnd()
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base)
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}